

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_settop(lua_State *L,int idx)

{
  int iVar1;
  int *piVar2;
  StkId pTVar3;
  StkId pTVar4;
  ulong uVar5;
  StkId pTVar6;
  LuaType *pLVar7;
  StkId pTVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  
  piVar2 = *(int **)&L[-1].hookmask;
  pTVar3 = L->ci->func;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0xb3,"void lua_settop(lua_State *, int)");
  }
  if (idx < 0) {
    if ((long)L->top + (-0x10 - (long)pTVar3) >> 4 < (long)(ulong)(uint)~idx) {
      __assert_fail("(-(idx+1) <= (L->top - (func + 1))) && \"invalid new top\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xbb,"void lua_settop(lua_State *, int)");
    }
    pTVar6 = L->top + (long)idx + 1;
  }
  else {
    uVar9 = (ulong)(uint)idx;
    if ((long)L->stack_last - (long)(pTVar3 + 1) >> 4 < (long)uVar9) {
      __assert_fail("(idx <= L->stack_last - (func + 1)) && \"new top too large\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xb5,"void lua_settop(lua_State *, int)");
    }
    pTVar4 = L->top;
    pTVar6 = pTVar3 + 1 + uVar9;
    if (pTVar4 < pTVar6) {
      auVar10 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pTVar8 = pTVar4 + 1;
      if (pTVar4 + 1 < pTVar3 + uVar9 + 1) {
        pTVar8 = pTVar3 + uVar9 + 1;
      }
      pLVar7 = &pTVar4[0x1f].tt_;
      uVar9 = 0;
      auVar14 = vpbroadcastq_avx512f();
      auVar14 = vpsrlq_avx512f(auVar14,4);
      do {
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vporq_avx512f(auVar15,auVar13);
        uVar5 = vpcmpuq_avx512f(auVar16,auVar14,2);
        if ((uVar5 & 1) != 0) {
          pLVar7[-0xf8] = 0;
        }
        if ((uVar5 & 2) != 0) {
          pLVar7[-0xf0] = 0;
        }
        if ((uVar5 & 4) != 0) {
          pLVar7[-0xe8] = 0;
        }
        if ((uVar5 & 8) != 0) {
          pLVar7[-0xe0] = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          pLVar7[-0xd8] = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          pLVar7[-0xd0] = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          pLVar7[-200] = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          pLVar7[-0xc0] = 0;
        }
        auVar16 = vporq_avx512f(auVar15,auVar12);
        uVar5 = vpcmpuq_avx512f(auVar16,auVar14,2);
        if ((uVar5 & 1) != 0) {
          pLVar7[-0xb8] = 0;
        }
        if ((uVar5 & 2) != 0) {
          pLVar7[-0xb0] = 0;
        }
        if ((uVar5 & 4) != 0) {
          pLVar7[-0xa8] = 0;
        }
        if ((uVar5 & 8) != 0) {
          pLVar7[-0xa0] = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          pLVar7[-0x98] = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          pLVar7[-0x90] = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          pLVar7[-0x88] = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          pLVar7[-0x80] = 0;
        }
        auVar16 = vporq_avx512f(auVar15,auVar11);
        uVar5 = vpcmpuq_avx512f(auVar16,auVar14,2);
        if ((uVar5 & 1) != 0) {
          pLVar7[-0x78] = 0;
        }
        if ((uVar5 & 2) != 0) {
          pLVar7[-0x70] = 0;
        }
        if ((uVar5 & 4) != 0) {
          pLVar7[-0x68] = 0;
        }
        if ((uVar5 & 8) != 0) {
          pLVar7[-0x60] = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          pLVar7[-0x58] = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          pLVar7[-0x50] = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          pLVar7[-0x48] = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          pLVar7[-0x40] = 0;
        }
        auVar15 = vporq_avx512f(auVar15,auVar10);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        if ((uVar5 & 1) != 0) {
          pLVar7[-0x38] = 0;
        }
        if ((uVar5 & 2) != 0) {
          pLVar7[-0x30] = 0;
        }
        if ((uVar5 & 4) != 0) {
          pLVar7[-0x28] = 0;
        }
        if ((uVar5 & 8) != 0) {
          pLVar7[-0x20] = 0;
        }
        if ((uVar5 & 0x10) != 0) {
          pLVar7[-0x18] = 0;
        }
        if ((uVar5 & 0x20) != 0) {
          pLVar7[-0x10] = 0;
        }
        if ((uVar5 & 0x40) != 0) {
          pLVar7[-8] = 0;
        }
        if ((uVar5 & 0x80) != 0) {
          *pLVar7 = 0;
        }
        uVar9 = uVar9 + 0x20;
        pLVar7 = pLVar7 + 0x100;
      } while ((((long)&pTVar8->value_ + ~(ulong)pTVar4 >> 4) + 0x20 & 0xffffffffffffffe0) != uVar9)
      ;
    }
  }
  L->top = pTVar6;
  *piVar2 = 0;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* 'subtract' index (index is negative) */
  }
  lua_unlock(L);
}